

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent,QScreen*,double,double>
               (QScreen *args,double args_1,double args_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  undefined1 *local_38;
  Data *pDStack_30;
  QObject *local_28;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent,QScreen*,double,double>
              (args,args_1,args_2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_002ff3ef;
  }
  local_28 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_30 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = 0xffffffff;
  uStack_1c = 0xffffffff;
  uStack_18 = 0xffffffff;
  uStack_14 = 0xffffffff;
  QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent::ScreenLogicalDotsPerInchEvent
            ((ScreenLogicalDotsPerInchEvent *)local_48,args,args_1,args_2);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)local_48);
LAB_002ff3c9:
    uVar4 = local_38._0_1_;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_48);
    if ((char)iVar3 != '\0') goto LAB_002ff3c9;
    uVar4 = 0;
  }
  QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent::~ScreenLogicalDotsPerInchEvent
            ((ScreenLogicalDotsPerInchEvent *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)uVar4;
  }
LAB_002ff3ef:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}